

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsReportBuilder.cpp
# Opt level: O1

void __thiscall KDReports::ReportBuilder::addVerticalSpacing(ReportBuilder *this,qreal space)

{
  QTextCursor *pQVar1;
  qreal qVar2;
  QTextBlockFormat blockFormat;
  QTextCharFormat charFormat;
  anon_union_24_3_e3d07ef4_for_data local_68;
  QTextBlockFormat local_48 [16];
  QTextCharFormat local_38 [16];
  QArrayDataPointer<char16_t> local_28;
  
  TextDocumentData::aboutToModifyContents(this->m_contentDocument,Append);
  pQVar1 = &this->m_cursor;
  QTextCursor::beginEditBlock();
  if (this->m_first == false) {
    QTextCursor::insertBlock();
  }
  else {
    this->m_first = false;
  }
  QTextBlockFormat::QTextBlockFormat(local_48);
  qVar2 = mmToPixels(space * 0.5);
  QVariant::QVariant((QVariant *)&local_68,qVar2);
  QTextFormat::setProperty((int)local_48,(QVariant *)0x1030);
  QVariant::~QVariant((QVariant *)&local_68);
  qVar2 = mmToPixels(space * 0.5);
  QVariant::QVariant((QVariant *)&local_68,qVar2);
  QTextFormat::setProperty((int)local_48,(QVariant *)0x1031);
  QVariant::~QVariant((QVariant *)&local_68);
  QTextCursor::setBlockFormat((QTextBlockFormat *)pQVar1);
  QTextCharFormat::QTextCharFormat(local_38);
  QVariant::QVariant((QVariant *)&local_68,1.0);
  QTextFormat::setProperty((int)local_38,(QVariant *)0x2001);
  QVariant::~QVariant((QVariant *)&local_68);
  QTextCursor::setCharFormat((QTextCharFormat *)pQVar1);
  local_68.shared = (PrivateShared *)0x0;
  local_68._8_8_ = L" ";
  local_68._16_8_ = 1;
  local_28.size = 0;
  local_28.d = (Data *)0x0;
  local_28.ptr = (char16_t *)0x0;
  QTextCursor::insertText((QString *)pQVar1);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_28);
  QTextCursor::endEditBlock();
  QTextFormat::~QTextFormat((QTextFormat *)local_38);
  QTextFormat::~QTextFormat((QTextFormat *)local_48);
  return;
}

Assistant:

void KDReports::ReportBuilder::addVerticalSpacing(qreal space)
{
    QTextCursor &cursor = this->cursor();
    cursor.beginEditBlock();

    if (!m_first) {
        cursor.insertBlock();
    } else {
        m_first = false;
    }

    QTextBlockFormat blockFormat;
    blockFormat.setTopMargin(KDReports::mmToPixels(space / 2));
    blockFormat.setBottomMargin(KDReports::mmToPixels(space / 2));
    cursor.setBlockFormat(blockFormat);
    QTextCharFormat charFormat;
    charFormat.setFontPointSize(1);
    cursor.setCharFormat(charFormat);
    cursor.insertText(QStringLiteral(" ")); // this ensures the point size 1 is actually used, making the paragraph much smaller
    cursor.endEditBlock();
}